

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.cpp
# Opt level: O2

void testStartWriteDeepTile(string *tempdir)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  undefined8 extraout_RAX;
  int *func;
  char *expr;
  int partidx;
  exr_context_t outf;
  uint32_t verflags;
  exr_storage_t storage;
  string outfn;
  int local_78 [2];
  code *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  std::operator+(&outfn,tempdir,"testattr.exr");
  func = local_78;
  local_28 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_18 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78[0] = 0x68;
  local_78[1] = 0;
  uStack_20 = 0xbf800000fffffffe;
  local_70 = err_cb;
  iVar1 = exr_start_write(&outf,outfn._M_dataplus._M_p,0);
  if (iVar1 == 0) {
    func = &partidx;
    iVar1 = exr_add_part(outf,"beauty",3);
    if (iVar1 != 0) goto LAB_0013844f;
    if (partidx != 0) goto LAB_001384b0;
    iVar1 = exr_get_count(outf,&partidx);
    if (iVar1 != 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
      poVar2 = std::operator<<(poVar2,") ");
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      poVar2 = std::operator<<(poVar2,pcVar3);
      std::endl<char,std::char_traits<char>>(poVar2);
      core_test_fail("exr_get_count (outf, &partidx)",(char *)0x103,0x320cc6,(char *)func);
LAB_0013851f:
      pcVar3 = (char *)0x104;
      expr = "partidx == 1";
      goto LAB_0013852b;
    }
    if (partidx != 1) goto LAB_0013851f;
    partidx = 0;
    iVar1 = exr_get_storage(outf,0,&storage);
    if (iVar1 != 0) goto LAB_00138537;
    if (storage != EXR_STORAGE_DEEP_TILED) goto LAB_00138598;
    iVar1 = exr_get_file_version_and_flags(outf,&verflags);
    if (iVar1 != 0) goto LAB_001385b0;
    if (verflags == 0x802) {
      iVar1 = exr_finish(&outf);
      if (iVar1 == 0) {
        remove(outfn._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&outfn);
        return;
      }
      goto LAB_00138629;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    core_test_fail("exr_start_write ( &outf, outfn.c_str (), EXR_WRITE_FILE_DIRECTLY, &cinit)",
                   (char *)0xfe,0x320cc6,(char *)func);
LAB_0013844f:
    poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    core_test_fail("exr_add_part (outf, \"beauty\", EXR_STORAGE_DEEP_TILED, &partidx)",(char *)0x101
                   ,0x320cc6,(char *)func);
LAB_001384b0:
    pcVar3 = (char *)0x102;
    expr = "partidx == 0";
LAB_0013852b:
    core_test_fail(expr,pcVar3,0x320cc6,(char *)func);
LAB_00138537:
    poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    core_test_fail("exr_get_storage (outf, partidx, &storage)",(char *)0x108,0x320cc6,(char *)func);
LAB_00138598:
    core_test_fail("storage == EXR_STORAGE_DEEP_TILED",(char *)0x109,0x320cc6,(char *)func);
LAB_001385b0:
    poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    core_test_fail("exr_get_file_version_and_flags (outf, &verflags)",(char *)0x10d,0x320cc6,
                   (char *)func);
  }
  core_test_fail("verflags == (2 | 0x00000800)",(char *)0x10e,0x320cc6,(char *)func);
LAB_00138629:
  poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,") ");
  pcVar3 = (char *)exr_get_default_error_message(iVar1);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  core_test_fail("exr_finish (&outf)",(char *)0x110,0x320cc6,(char *)func);
  std::__cxx11::string::~string((string *)&outfn);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
testStartWriteDeepTile (const std::string& tempdir)
{
    exr_context_t outf;
    std::string   outfn = tempdir + "testattr.exr";
    int           partidx;

    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    EXRCORE_TEST_RVAL (exr_start_write (
        &outf, outfn.c_str (), EXR_WRITE_FILE_DIRECTLY, &cinit));

    EXRCORE_TEST_RVAL (
        exr_add_part (outf, "beauty", EXR_STORAGE_DEEP_TILED, &partidx));
    EXRCORE_TEST (partidx == 0);
    EXRCORE_TEST_RVAL (exr_get_count (outf, &partidx));
    EXRCORE_TEST (partidx == 1);
    partidx = 0;

    exr_storage_t storage;
    EXRCORE_TEST_RVAL (exr_get_storage (outf, partidx, &storage));
    EXRCORE_TEST (storage == EXR_STORAGE_DEEP_TILED);

    uint32_t verflags;
    EXRCORE_TEST_RVAL (
        exr_get_file_version_and_flags (outf, &verflags));
    EXRCORE_TEST (verflags == (2 | 0x00000800));

    EXRCORE_TEST_RVAL (exr_finish (&outf));
    remove (outfn.c_str ());
}